

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int nonce_function_ecdsa_adaptor
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *pk33,uchar *algo,size_t algolen,
              void *data)

{
  int iVar1;
  int local_cc;
  byte local_c8 [4];
  int i;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  size_t algolen_local;
  uchar *algo_local;
  uchar *pk33_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  if (algo == (uchar *)0x0) {
    nonce32_local._4_4_ = 0;
  }
  else {
    if (data != (void *)0x0) {
      secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged_aux
                ((secp256k1_sha256 *)(masked_key + 0x18));
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),(uchar *)data,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),local_c8);
      for (local_cc = 0; local_cc < 0x20; local_cc = local_cc + 1) {
        local_c8[local_cc] = local_c8[local_cc] ^ key32[local_cc];
      }
    }
    if ((algolen == 0x10) &&
       (iVar1 = secp256k1_memcmp_var(algo,"ECDSAadaptor/non",0x10), iVar1 == 0)) {
      secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged((secp256k1_sha256 *)(masked_key + 0x18));
    }
    else if ((algolen == 4) && (iVar1 = secp256k1_memcmp_var(algo,"DLEQ",4), iVar1 == 0)) {
      secp256k1_nonce_function_dleq_sha256_tagged((secp256k1_sha256 *)(masked_key + 0x18));
    }
    else {
      secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)(masked_key + 0x18),algo,algolen);
    }
    if (data == (void *)0x0) {
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),key32,0x20);
    }
    else {
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),local_c8,0x20);
    }
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),pk33,0x21);
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),msg32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),nonce32);
    nonce32_local._4_4_ = 1;
  }
  return nonce32_local._4_4_;
}

Assistant:

static int nonce_function_ecdsa_adaptor(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *pk33, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithims. An optimized tagging implementation is used if the default
     * tag is provided. */
    if (algolen == sizeof(ecdsa_adaptor_algo)
            && secp256k1_memcmp_var(algo, ecdsa_adaptor_algo, algolen) == 0) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(&sha);
    } else if (algolen == sizeof(dleq_algo)
            && secp256k1_memcmp_var(algo, dleq_algo, algolen) == 0) {
        secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per BIP-340 */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, pk33, 33);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}